

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::logRule
          (ValidStatusCodes *this,TestLog *log,string *ruleName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rules)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  reference value;
  _Self local_1d0;
  _Self local_1c8;
  const_iterator it;
  undefined1 local_1b0 [8];
  MessageBuilder msg;
  ScopedLogSection section;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rules_local;
  string *ruleName_local;
  TestLog *log_local;
  ValidStatusCodes *this_local;
  
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(rules);
  if (!bVar1) {
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&msg.field_0x178,log,ruleName,ruleName);
    tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_1b0,log);
    tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char (*) [8])"Rules:\n");
    local_1c8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(rules);
    while( true ) {
      local_1d0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(rules);
      bVar1 = std::operator!=(&local_1c8,&local_1d0);
      if (!bVar1) break;
      pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char (*) [5])"\t * ");
      value = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_1c8);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,value);
      tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x12b9f11);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_1c8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&msg.field_0x178);
  }
  return;
}

Assistant:

void ValidStatusCodes::logRule (tcu::TestLog& log, const std::string& ruleName, const std::set<std::string>& rules) const
{
	if (!rules.empty())
	{
		const tcu::ScopedLogSection		section	(log, ruleName, ruleName);
		tcu::MessageBuilder				msg		(&log);

		msg << "Rules:\n";
		for (std::set<std::string>::const_iterator it = rules.begin(); it != rules.end(); ++it)
			msg << "\t * " << *it << "\n";
		msg << TestLog::EndMessage;
	}
}